

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O1

Roman_int * get_numeral(Roman_int *__return_storage_ptr__,istream *is)

{
  long lVar1;
  istream *piVar2;
  long lVar3;
  char ch;
  ostringstream ss;
  char local_1c9;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  do {
    piVar2 = std::operator>>(is,&local_1c9);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
LAB_0010433f:
      std::__cxx11::stringbuf::str();
      Roman_int::Roman_int(__return_storage_ptr__,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1c8._M_dataplus._M_p._1_7_,(char)local_1c8._M_dataplus._M_p) !=
          &local_1c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1c8._M_dataplus._M_p._1_7_,(char)local_1c8._M_dataplus._M_p),
                        local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    if (local_1c9 != 'I') {
      lVar1 = 1;
      do {
        lVar3 = lVar1;
        if (lVar3 == 7) goto LAB_00104337;
        lVar1 = lVar3 + 1;
      } while ("IVXLCDM"[lVar3] != local_1c9);
      if (lVar3 == 7) {
LAB_00104337:
        std::istream::unget();
        goto LAB_0010433f;
      }
    }
    local_1c8._M_dataplus._M_p._0_1_ = local_1c9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  } while( true );
}

Assistant:

Roman_int get_numeral(std::istream& is)
{
	std::ostringstream ss;
	char ch;
	while (is >> ch)
	{
		if (!is_numeral(ch))
		{
			is.unget();
			break;
		}
		ss << ch;
	}
	return Roman_int{ ss.str() };
}